

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O0

void FFSconvert_record(IOConversionPtr conv,void *src,void *dest,void *final_string_base,
                      void *src_string_base)

{
  int iVar1;
  IOConversionPtr in_RCX;
  undefined8 in_RDX;
  long lVar2;
  long in_RSI;
  void *in_RDI;
  IOConversionPtr in_R8;
  int *tmp;
  int limit;
  int i;
  run_time_conv_status rtcs;
  conv_status cs;
  int local_a0;
  int local_9c;
  undefined1 local_98 [16];
  long local_88;
  long local_60;
  long local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 local_40;
  void *in_stack_ffffffffffffffc8;
  IOConversionPtr p_Var3;
  
  if (in_R8 == (IOConversionPtr)0x0) {
    in_R8 = in_RCX;
  }
  if (*(long *)((long)in_RDI + 0x58) == 0) {
    local_60 = -*(long *)((long)in_RDI + 0x80);
    local_58 = -*(long *)((long)in_RDI + 0x80);
    local_50 = 0;
    local_48 = 0;
    local_40 = *(undefined4 *)((long)in_RDI + 0x28);
    internal_convert_record
              (in_RCX,(ConvStatus)in_R8,in_RDI,in_stack_ffffffffffffffc8,
               *(int *)(*(long *)(*(long *)((long)in_RDI + 0x38) + 0x38) + 0x3c));
  }
  else {
    iVar1 = debug_code_generation();
    if (iVar1 != 0) {
      local_a0 = 0x1e;
      lVar2 = (long)in_R8 % 4;
      p_Var3 = in_R8;
      printf("record of type \"%s\", contents :\n",
             *(undefined8 *)(*(long *)(*(long *)((long)in_RDI + 0x38) + 0x38) + 0x10));
      if (*(uint *)(*(long *)(*(long *)((long)in_RDI + 0x38) + 0x38) + 0x30) < 0x78) {
        local_a0 = (int)((ulong)(long)*(int *)(*(long *)(*(long *)((long)in_RDI + 0x38) + 0x38) +
                                              0x30) >> 2);
      }
      for (local_9c = 0; local_9c < local_a0; local_9c = local_9c + 4) {
        printf("%p: %8x %8x %8x %8x\n",in_RSI + (local_9c << 2),
               (ulong)*(uint *)(in_RSI + (long)local_9c * 4),
               (ulong)*(uint *)(in_RSI + (long)(local_9c + 1) * 4),
               (ulong)*(uint *)(in_RSI + (long)(local_9c + 2) * 4),
               (ulong)*(uint *)(in_RSI + (long)(local_9c + 3) * 4));
      }
      if (p_Var3 != (IOConversionPtr)0x0) {
        printf("string contents :\n");
        for (local_9c = 0; local_9c < 10; local_9c = local_9c + 4) {
          printf("%p: %8x %8x %8x %8x\n",(long)in_R8 + ((local_9c << 2) - lVar2),
                 (ulong)*(uint *)((long)in_R8 + ((long)local_9c * 4 - lVar2)),
                 (ulong)*(uint *)((long)in_R8 + ((long)(local_9c + 1) * 4 - lVar2)),
                 (ulong)*(uint *)((long)in_R8 + ((long)(local_9c + 2) * 4 - lVar2)),
                 (ulong)*(uint *)((long)in_R8 + ((long)(local_9c + 3) * 4 - lVar2)));
        }
      }
    }
    local_88 = -*(long *)((long)in_RDI + 0x80);
    (**(code **)((long)in_RDI + 0x58))(in_RSI,in_RDX,local_98);
  }
  return;
}

Assistant:

void
FFSconvert_record(IOConversionPtr conv, void *src, void *dest, void *final_string_base, void *src_string_base)
{
    struct conv_status cs;
    if (src_string_base == NULL) {
	src_string_base = final_string_base;
    }
    if (conv->conv_func) {
	struct run_time_conv_status rtcs;
	if (debug_code_generation()) {
	    int i;
	    int limit = 30;
	    int *tmp = (int *) (((char *) src_string_base) -
				(((intptr_t) src_string_base) % 4));
	    printf("record of type \"%s\", contents :\n", 
		   conv->ioformat->body->format_name);
	    if (limit * sizeof(int) > conv->ioformat->body->record_length)
		limit = conv->ioformat->body->record_length / sizeof(int);
	    for (i = 0; i < limit; i += 4) {
		printf("%p: %8x %8x %8x %8x\n", ((char *) src) + (i * 4),
		       ((int *) src)[i], ((int *) src)[i + 1],
		       ((int *) src)[i + 2], ((int *) src)[i + 3]);
	    }
	    if (src_string_base != NULL) {
		printf("string contents :\n");
		limit = 10;
/*		if (conv->ioformat->body->variant) {
		    FILE_INT record_len;
		    int len_align_pad = (4 - conv->ioformat->body->server_ID.length) & 3;
		    FILE_INT *len_ptr = (FILE_INT *) (src + conv->ioformat->body->server_ID.length +
						      len_align_pad);
		    memcpy(&record_len, len_ptr, sizeof(FILE_INT));
		    if (conv->ioformat->body->byte_reversal)
			byte_swap((char *) &record_len, 4);
		    record_len -= conv->ioformat->body->record_length;
		    if (limit * sizeof(int) > record_len) {
			limit = record_len / sizeof(int);
		    }
		}
*/		for (i = 0; i < limit; i += 4) {
		    printf("%p: %8x %8x %8x %8x\n", ((char *) tmp) + (i * 4),
			   ((int *) tmp)[i],
			   ((int *) tmp)[i + 1],
			   ((int *) tmp)[i + 2],
			   ((int *) tmp)[i + 3]);
		}
	    }
	}
	rtcs.src_pointer_base = src_string_base;
	rtcs.dest_pointer_base = final_string_base;
	rtcs.dest_offset_adjust = -(ssize_t) conv->string_offset_size;
	conv->conv_func(src, dest, &rtcs);
	return;
    } else {
	cs.src_pointer_base = src_string_base;
	cs.dest_pointer_base = final_string_base;
	cs.src_offset_adjust = -(ssize_t)conv->string_offset_size;
	cs.dest_offset_adjust = -(ssize_t)conv->string_offset_size;
	cs.cur_offset = 0;
	cs.control_value = NULL;
	cs.target_pointer_size = conv->target_pointer_size;
	cs.src_pointer_size = conv->ioformat->body->pointer_size;
	cs.global_conv = conv;
	internal_convert_record(conv, &cs, src, dest, 1);
    }
}